

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

char * ImGui::GetKeyName(ImGuiKey key)

{
  uint uVar1;
  uint uVar2;
  
  if (key == ImGuiKey_KeysData_OFFSET) {
    return "None";
  }
  if ((key < ImGuiKey_NamedKey_BEGIN) &&
     (key = (GImGui->IO).KeyMap[key], key == ~ImGuiKey_KeysData_OFFSET)) {
    return "N/A";
  }
  if ((((key & ImGuiMod_Mask_) != ImGuiKey_KeysData_OFFSET) &&
      (uVar1 = key - ImGuiKey_ModCtrl >> 0xc, uVar2 = key << 0x14 | uVar1, uVar2 < 8)) &&
     ((0x8bU >> (uVar1 & 0x1f) & 1) != 0)) {
    key = *(ImGuiKey *)(&DAT_001f98e0 + (ulong)uVar2 * 4);
  }
  if (key - ImGuiKey_NamedKey_BEGIN < 0x9a) {
    return _ZL9GKeyNames_rel +
           *(int *)(_ZL9GKeyNames_rel + (ulong)(key - ImGuiKey_NamedKey_BEGIN) * 4);
  }
  return "Unknown";
}

Assistant:

const char* ImGui::GetKeyName(ImGuiKey key)
{
    if (key == ImGuiKey_None)
        return "None";
#ifdef IMGUI_DISABLE_OBSOLETE_KEYIO
    IM_ASSERT(IsNamedKeyOrMod(key) && "Support for user key indices was dropped in favor of ImGuiKey. Please update backend and user code.");
#else
    ImGuiContext& g = *GImGui;
    if (IsLegacyKey(key))
    {
        if (g.IO.KeyMap[key] == -1)
            return "N/A";
        IM_ASSERT(IsNamedKey((ImGuiKey)g.IO.KeyMap[key]));
        key = (ImGuiKey)g.IO.KeyMap[key];
    }
#endif
    if (key & ImGuiMod_Mask_)
        key = ConvertSingleModFlagToKey(key);
    if (!IsNamedKey(key))
        return "Unknown";

    return GKeyNames[key - ImGuiKey_NamedKey_BEGIN];
}